

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode global_init(long flags,_Bool memoryfuncs)

{
  CURLcode CVar1;
  int iVar2;
  _Bool memoryfuncs_local;
  long flags_local;
  
  if (initialized == 0) {
    if (memoryfuncs) {
      Curl_cmalloc = malloc;
      Curl_cfree = free;
      Curl_crealloc = realloc;
      Curl_cstrdup = strdup;
      Curl_ccalloc = calloc;
    }
    initialized = initialized + 1;
    CVar1 = Curl_trc_init();
    if ((CVar1 == CURLE_OK) && (iVar2 = Curl_ssl_init(), iVar2 != 0)) {
      flags_local._4_4_ = CURLE_OK;
      easy_init_flags = flags;
    }
    else {
      initialized = initialized - 1;
      flags_local._4_4_ = CURLE_FAILED_INIT;
    }
  }
  else {
    flags_local._4_4_ = CURLE_OK;
    initialized = initialized + 1;
  }
  return flags_local._4_4_;
}

Assistant:

static CURLcode global_init(long flags, bool memoryfuncs)
{
  if(initialized++)
    return CURLE_OK;

  if(memoryfuncs) {
    /* Setup the default memory functions here (again) */
    Curl_cmalloc = (curl_malloc_callback)malloc;
    Curl_cfree = (curl_free_callback)free;
    Curl_crealloc = (curl_realloc_callback)realloc;
    Curl_cstrdup = (curl_strdup_callback)system_strdup;
    Curl_ccalloc = (curl_calloc_callback)calloc;
#if defined(_WIN32) && defined(UNICODE)
    Curl_cwcsdup = (curl_wcsdup_callback)_wcsdup;
#endif
  }

  if(Curl_trc_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_trc_init failed\n"));
    goto fail;
  }

  if(!Curl_ssl_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_ssl_init failed\n"));
    goto fail;
  }

  if(Curl_win32_init(flags)) {
    DEBUGF(fprintf(stderr, "Error: win32_init failed\n"));
    goto fail;
  }

  if(Curl_amiga_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_amiga_init failed\n"));
    goto fail;
  }

  if(Curl_macos_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_macos_init failed\n"));
    goto fail;
  }

  if(Curl_resolver_global_init()) {
    DEBUGF(fprintf(stderr, "Error: resolver_global_init failed\n"));
    goto fail;
  }

  if(Curl_ssh_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_ssh_init failed\n"));
    goto fail;
  }

  easy_init_flags = flags;

#ifdef DEBUGBUILD
  if(getenv("CURL_GLOBAL_INIT"))
    /* alloc data that will leak if *cleanup() is not called! */
    leakpointer = malloc(1);
#endif

  return CURLE_OK;

fail:
  initialized--; /* undo the increase */
  return CURLE_FAILED_INIT;
}